

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

Var __thiscall Js::RecyclableObjectAddress::GetValue(RecyclableObjectAddress *this,BOOL fUpdated)

{
  bool bVar1;
  BOOL BVar2;
  RecyclableObject *this_00;
  ScriptContext *this_01;
  ThreadContext *pTVar3;
  undefined1 local_48 [8];
  TTModeStackAutoPopper suppressModeAutoPopper;
  Var objValue;
  ScriptContext *requestContext;
  RecyclableObject *obj;
  BOOL fUpdated_local;
  RecyclableObjectAddress *this_local;
  
  if (fUpdated == 0) {
    this_local = (RecyclableObjectAddress *)this->value;
  }
  else {
    bVar1 = VarIs<Js::RecyclableObject>(this->parentObj);
    if (bVar1) {
      this_00 = VarTo<Js::RecyclableObject>(this->parentObj);
      this_01 = RecyclableObject::GetScriptContext(this_00);
      suppressModeAutoPopper.m_popMode = Invalid;
      suppressModeAutoPopper._12_4_ = 0;
      pTVar3 = ScriptContext::GetThreadContext(this_01);
      TTD::TTModeStackAutoPopper::TTModeStackAutoPopper
                ((TTModeStackAutoPopper *)local_48,pTVar3->TTDLog);
      pTVar3 = ScriptContext::GetThreadContext(this_01);
      bVar1 = ThreadContext::IsRuntimeInTTDMode(pTVar3);
      if (bVar1) {
        TTD::TTModeStackAutoPopper::PushModeAndSetToAutoPop
                  ((TTModeStackAutoPopper *)local_48,DebuggerSuppressGetter);
      }
      BVar2 = Js::JavascriptOperators::GetProperty
                        (this_00,this->propId,(Var *)&suppressModeAutoPopper.m_popMode,this_01,
                         (PropertyValueInfo *)0x0);
      if (BVar2 != 0) {
        this_local = (RecyclableObjectAddress *)suppressModeAutoPopper._8_8_;
      }
      TTD::TTModeStackAutoPopper::~TTModeStackAutoPopper((TTModeStackAutoPopper *)local_48);
      if (BVar2 != 0) {
        return this_local;
      }
    }
    this_local = (RecyclableObjectAddress *)0x0;
  }
  return this_local;
}

Assistant:

Var RecyclableObjectAddress::GetValue(BOOL fUpdated)
    {
        if (!fUpdated)
        {
            return value;
        }

        if (Js::VarIs<Js::RecyclableObject>(parentObj))
        {
            Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(parentObj);

            ScriptContext* requestContext = obj->GetScriptContext();
            Var objValue = nullptr;

#if ENABLE_TTD
            TTD::TTModeStackAutoPopper suppressModeAutoPopper(requestContext->GetThreadContext()->TTDLog);
            if(requestContext->GetThreadContext()->IsRuntimeInTTDMode())
            {
                suppressModeAutoPopper.PushModeAndSetToAutoPop(TTD::TTDMode::DebuggerSuppressGetter);
            }
#endif

            if (Js::JavascriptOperators::GetProperty(obj, propId, &objValue, requestContext))
            {
                return objValue;
            }
        }

        return nullptr;
    }